

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# circuit_editor.cpp
# Opt level: O2

uptr_t lsim::gui::CircuitEditorFactory::create_circuit(ModelCircuit *circuit)

{
  ModelComponent *component_model;
  ModelCircuit *in_RSI;
  __uniq_ptr_data<lsim::gui::CircuitEditor,_std::default_delete<lsim::gui::CircuitEditor>,_true,_true>
  in_RDI;
  uint *comp_id;
  pointer puVar1;
  __single_object editor;
  vector<unsigned_int,_std::allocator<unsigned_int>_> comp_ids;
  _Head_base<0UL,_lsim::gui::CircuitEditor_*,_false> local_40;
  ModelCircuit *local_38;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_30;
  
  local_38 = in_RSI;
  std::make_unique<lsim::gui::CircuitEditor,lsim::ModelCircuit*&>((ModelCircuit **)&local_40);
  ModelCircuit::component_ids
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_30,local_38);
  for (puVar1 = local_30._M_impl.super__Vector_impl_data._M_start;
      puVar1 != local_30._M_impl.super__Vector_impl_data._M_finish; puVar1 = puVar1 + 1) {
    component_model = ModelCircuit::component_by_id(local_38,*puVar1);
    CircuitEditor::create_widget_for_component(local_40._M_head_impl,component_model);
  }
  *(CircuitEditor **)
   in_RDI.
   super___uniq_ptr_impl<lsim::gui::CircuitEditor,_std::default_delete<lsim::gui::CircuitEditor>_>.
   _M_t.
   super__Tuple_impl<0UL,_lsim::gui::CircuitEditor_*,_std::default_delete<lsim::gui::CircuitEditor>_>
   .super__Head_base<0UL,_lsim::gui::CircuitEditor_*,_false>._M_head_impl = local_40._M_head_impl;
  local_40._M_head_impl = (CircuitEditor *)0x0;
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_30);
  std::unique_ptr<lsim::gui::CircuitEditor,_std::default_delete<lsim::gui::CircuitEditor>_>::
  ~unique_ptr((unique_ptr<lsim::gui::CircuitEditor,_std::default_delete<lsim::gui::CircuitEditor>_>
               *)&local_40);
  return (__uniq_ptr_data<lsim::gui::CircuitEditor,_std::default_delete<lsim::gui::CircuitEditor>,_true,_true>
          )(tuple<lsim::gui::CircuitEditor_*,_std::default_delete<lsim::gui::CircuitEditor>_>)
           in_RDI.
           super___uniq_ptr_impl<lsim::gui::CircuitEditor,_std::default_delete<lsim::gui::CircuitEditor>_>
           ._M_t.
           super__Tuple_impl<0UL,_lsim::gui::CircuitEditor_*,_std::default_delete<lsim::gui::CircuitEditor>_>
           .super__Head_base<0UL,_lsim::gui::CircuitEditor_*,_false>._M_head_impl;
}

Assistant:

CircuitEditor::uptr_t CircuitEditorFactory::create_circuit(ModelCircuit *circuit) {
	auto editor = std::make_unique<CircuitEditor>(circuit);

	auto comp_ids = circuit->component_ids();
    for (const auto &comp_id : comp_ids) {
		auto comp = circuit->component_by_id(comp_id);
		editor->create_widget_for_component(comp);
	}

    return std::move(editor);
}